

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Operations::Operations(Operations *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  size_t __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ifstream in;
  path local_258;
  undefined1 local_238 [16];
  _func_int *local_228 [30];
  undefined8 local_138 [33];
  
  Configuration::Configuration(&this->config);
  this->loadStatus = Unloaded;
  this->inferredComponents = false;
  std::__cxx11::string::string((string *)&this->programName,*argv,(allocator *)local_238);
  p_Var1 = &(this->commands)._M_t._M_impl.super__Rb_tree_header;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->allArgs,
             argv + 1,argv + argc,(allocator_type *)local_238);
  (this->components)._M_h._M_buckets = &(this->components)._M_h._M_single_bucket;
  (this->components)._M_h._M_bucket_count = 1;
  (this->components)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->components)._M_h._M_element_count = 0;
  __nbytes = 0x3f800000;
  (this->components)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->components)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->components)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->files)._M_h._M_buckets = &(this->files)._M_h._M_single_bucket;
  (this->files)._M_h._M_bucket_count = 1;
  (this->files)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->files)._M_h._M_element_count = 0;
  (this->files)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->files)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->files)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->collisions)._M_t._M_impl.super__Rb_tree_header;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->includeLookup)._M_h._M_buckets = &(this->includeLookup)._M_h._M_single_bucket;
  (this->includeLookup)._M_h._M_bucket_count = 1;
  (this->includeLookup)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->includeLookup)._M_h._M_element_count = 0;
  (this->includeLookup)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->includeLookup)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->includeLookup)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->ambiguous)._M_t._M_impl.super__Rb_tree_header;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->deleteComponents)._M_t._M_impl.super__Rb_tree_header;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->outputRoot).m_pathname._M_dataplus._M_p = (pointer)&(this->outputRoot).m_pathname.field_2;
  (this->outputRoot).m_pathname._M_string_length = 0;
  (this->outputRoot).m_pathname.field_2._M_local_buf[0] = '\0';
  (this->projectRoot).m_pathname._M_dataplus._M_p = (pointer)&(this->projectRoot).m_pathname.field_2
  ;
  (this->projectRoot).m_pathname._M_string_length = 0;
  (this->projectRoot).m_pathname.field_2._M_local_buf[0] = '\0';
  this->recursive = false;
  local_238._0_8_ = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"config-cpp-dependencies.txt","");
  boost::filesystem::detail::status(&local_258,(error_code *)local_238);
  iVar3 = (int)local_258.m_pathname._M_dataplus._M_p;
  if ((_func_int **)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_);
  }
  if (iVar3 == 2) {
    paVar2 = &local_258.m_pathname.field_2;
    local_258.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,"config-cpp-dependencies.txt","");
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_238,&local_258);
    __buf = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_258.m_pathname._M_dataplus._M_p);
      __buf = extraout_RDX_00;
    }
    Configuration::read(&this->config,(int)local_238,__buf,__nbytes);
    local_238._0_8_ =
         std::ifstream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
         construction_vtable + 0x18;
    local_138[0] = 0x137b70;
    std::filebuf::~filebuf((filebuf *)local_228);
    local_238._0_8_ =
         std::istream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
         construction_vtable + 0x18;
    local_138[0] = 0x137bc0;
    local_238._8_8_ = (error_category *)0x0;
    std::ios_base::~ios_base((ios_base *)local_138);
  }
  RegisterCommands(this);
  boost::filesystem::detail::current_path((error_code *)local_238);
  std::__cxx11::string::operator=((string *)&this->outputRoot,(string *)local_238);
  std::__cxx11::string::_M_assign((string *)&this->projectRoot);
  if ((_func_int **)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_);
  }
  return;
}

Assistant:

Operations(int argc, const char** argv)
    : loadStatus(Unloaded)
    , inferredComponents(false)
    , programName(argv[0])
    , allArgs(argv+1, argv+argc)
    , recursive(false)
    {
        if (filesystem::is_regular_file(CONFIG_FILE)) {
            streams::ifstream in(CONFIG_FILE);
            config.read(in);
        }
        RegisterCommands();
        projectRoot = outputRoot = filesystem::current_path();
    }